

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O1

uint __thiscall xercesc_4_0::CMStateSetEnumerator::nextElement(CMStateSetEnumerator *this)

{
  uint uVar1;
  uint uVar2;
  uint unaff_EBX;
  uint uVar3;
  uint uVar4;
  
  uVar3 = 0;
  while( true ) {
    uVar4 = 1 << ((byte)uVar3 & 0x1f);
    uVar1 = this->fLastValue;
    if ((uVar1 >> (uVar3 & 0x1f) & 1) != 0) {
      unaff_EBX = (int)this->fIndexCount + uVar3;
      uVar2 = ~uVar4 & uVar1;
      this->fLastValue = uVar2;
      if (uVar2 == 0) {
        findNext(this);
      }
    }
    if ((uVar1 & uVar4) != 0) break;
    uVar3 = uVar3 + 1;
    if (uVar3 == 0x20) {
      return 0;
    }
  }
  return unaff_EBX;
}

Assistant:

unsigned int nextElement()
    {
        for(int i=0;i<32;i++)
        {
            XMLInt32 mask=1UL << i;
            if(fLastValue & mask)
            {
                fLastValue &= ~mask;
                unsigned int retVal=(unsigned int)fIndexCount+i;
                if(fLastValue==0)
                    findNext();
                return retVal;
            }
        }
        return 0;
    }